

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::Clara::Detail::convertInto(string *_source,bool *_dest)

{
  bool bVar1;
  runtime_error *this;
  bool bVar2;
  string sourceLC;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&sourceLC,(string *)_source);
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(char)>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )sourceLC._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(sourceLC._M_dataplus._M_p + sourceLC._M_string_length),
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )sourceLC._M_dataplus._M_p,toLowerCh);
  bVar1 = std::operator==(&sourceLC,"y");
  bVar2 = true;
  if (!bVar1) {
    bVar1 = std::operator==(&sourceLC,"1");
    if (!bVar1) {
      bVar1 = std::operator==(&sourceLC,"true");
      if (!bVar1) {
        bVar1 = std::operator==(&sourceLC,"yes");
        if (!bVar1) {
          bVar1 = std::operator==(&sourceLC,"on");
          if (!bVar1) {
            bVar1 = std::operator==(&sourceLC,"n");
            if (!bVar1) {
              bVar1 = std::operator==(&sourceLC,"0");
              if (!bVar1) {
                bVar1 = std::operator==(&sourceLC,"false");
                if (!bVar1) {
                  bVar1 = std::operator==(&sourceLC,"no");
                  if (!bVar1) {
                    bVar1 = std::operator==(&sourceLC,"off");
                    if (!bVar1) {
                      this = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::operator+(&local_60,
                                     "Expected a boolean value but did not recognise:\n  \'",_source
                                    );
                      std::operator+(&local_40,&local_60,"\'");
                      std::runtime_error::runtime_error(this,(string *)&local_40);
                      __cxa_throw(this,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                  }
                }
              }
            }
            bVar2 = false;
          }
        }
      }
    }
  }
  *_dest = bVar2;
  std::__cxx11::string::~string((string *)&sourceLC);
  return;
}

Assistant:

inline void convertInto( std::string const& _source, bool& _dest ) {
            std::string sourceLC = _source;
            std::transform( sourceLC.begin(), sourceLC.end(), sourceLC.begin(), toLowerCh );
            if( sourceLC == "y" || sourceLC == "1" || sourceLC == "true" || sourceLC == "yes" || sourceLC == "on" )
                _dest = true;
            else if( sourceLC == "n" || sourceLC == "0" || sourceLC == "false" || sourceLC == "no" || sourceLC == "off" )
                _dest = false;
            else
                throw std::runtime_error( "Expected a boolean value but did not recognise:\n  '" + _source + "'" );
        }